

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O2

bool __thiscall
gguf_reader::read<unsigned_char>
          (gguf_reader *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *dst,size_t n)

{
  pointer puVar1;
  ulong uVar2;
  bool bVar3;
  ulong uVar4;
  ulong uVar5;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(dst,n);
  uVar2 = 0;
  do {
    uVar4 = uVar2;
    puVar1 = (dst->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    uVar5 = (long)(dst->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)puVar1;
    if (uVar5 <= uVar4) break;
    bVar3 = read<unsigned_char>(this,puVar1 + uVar4);
    uVar2 = uVar4 + 1;
  } while (bVar3);
  return uVar5 <= uVar4;
}

Assistant:

bool read(std::vector<T> & dst, const size_t n) const {
        dst.resize(n);
        for (size_t i = 0; i < dst.size(); ++i) {
            if constexpr (std::is_same<T, bool>::value) {
                bool tmp;
                if (!read(tmp)) {
                    return false;
                }
                dst[i] = tmp;
            } else {
                if (!read(dst[i])) {
                    return false;
                }
            }
        }
        return true;
    }